

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::word(Forth *this)

{
  CAddr CVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  byte bVar4;
  uint uVar5;
  Cell CVar6;
  Cell CVar7;
  int iVar8;
  ulong uVar9;
  string wordBuffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  ForthStack<unsigned_int> *local_58;
  string local_50;
  
  requireDStackDepth(this,1,"WORD");
  local_58 = &this->dStack;
  uVar5 = ForthStack<unsigned_int>::getTop(local_58);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (&local_78,'\0');
  CVar6 = dataSpaceAtCell(this,this->VarOffsetSourceSize);
  CVar7 = dataSpaceAtCell(this,this->VarOffsetSourceOffset);
  if (0 < (int)(CVar6 - CVar7)) {
    CVar6 = dataSpaceAtCell(this,this->VarOffsetSourceAddress);
    CVar7 = dataSpaceAtCell(this,this->VarOffsetSourceOffset);
    bVar4 = dataSpaceAt(this,CVar7 + CVar6);
    while( true ) {
      CVar6 = dataSpaceAtCell(this,this->VarOffsetSourceSize);
      CVar7 = dataSpaceAtCell(this,this->VarOffsetSourceOffset);
      if ((int)(CVar6 - CVar7) < 1) break;
      if ((int)(char)uVar5 != (uint)bVar4) {
        if ((uVar5 & 0xff) != 0x20) break;
        iVar8 = isspace((uint)bVar4);
        if (iVar8 == 0) break;
      }
      incSourceBufferOffset(this);
      CVar6 = dataSpaceAtCell(this,this->VarOffsetSourceAddress);
      CVar7 = dataSpaceAtCell(this,this->VarOffsetSourceOffset);
      bVar4 = dataSpaceAt(this,CVar7 + CVar6);
    }
  }
  CVar6 = dataSpaceAtCell(this,this->VarOffsetSourceSize);
  CVar7 = dataSpaceAtCell(this,this->VarOffsetSourceOffset);
  if (0 < (int)(CVar6 - CVar7)) {
    while( true ) {
      CVar6 = dataSpaceAtCell(this,this->VarOffsetSourceSize);
      CVar7 = dataSpaceAtCell(this,this->VarOffsetSourceOffset);
      if ((int)(CVar6 - CVar7) < 1) break;
      CVar6 = dataSpaceAtCell(this,this->VarOffsetSourceAddress);
      CVar7 = dataSpaceAtCell(this,this->VarOffsetSourceOffset);
      bVar4 = dataSpaceAt(this,CVar7 + CVar6);
      if ((int)(char)uVar5 == (uint)bVar4) break;
      if ((uVar5 & 0xff) == 0x20) {
        iVar8 = isspace((uint)bVar4);
        if (iVar8 != 0) break;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&local_78,bVar4);
      incSourceBufferOffset(this);
    }
    CVar6 = dataSpaceAtCell(this,this->VarOffsetSourceSize);
    CVar7 = dataSpaceAtCell(this,this->VarOffsetSourceOffset);
    if (0 < (int)(CVar6 - CVar7)) {
      incSourceBufferOffset(this);
    }
  }
  sVar3 = local_78._M_string_length;
  _Var2._M_p = local_78._M_dataplus._M_p;
  if (local_78._M_string_length < 0x100) {
    *local_78._M_dataplus._M_p = (char)local_78._M_string_length + -1;
    if (local_78._M_string_length != 0) {
      CVar1 = this->VarOffsetWordBuffer;
      uVar9 = 0;
      do {
        dataSpaceSet(this,CVar1 + (int)uVar9,_Var2._M_p[uVar9]);
        uVar9 = uVar9 + 1;
      } while (sVar3 != uVar9);
    }
    ForthStack<unsigned_int>::setTop(local_58,this->VarOffsetWordBuffer);
  }
  else {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"WORD: very long word ","");
    throwMessage(this,&local_50,errorParsedStringOverflow);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void  word() {
			REQUIRE_DSTACK_DEPTH(1, "WORD");
			auto delim = static_cast<char>(dStack.getTop());
			/****

			I need a buffer to store the result of the Forth `WORD` word.  As with the
			input buffer, I use a `std::string` so I don't need to worry about memory
			management.

			Note that while this is a `std::string`, its format is not a typical strings.
			The buffer returned by `WORD` has the word length as its first character.
			That is, it is a Forth _counted string_.

			****/

			std::string wordBuffer{};
			wordBuffer.push_back(0);  // First char of buffer is length.
			// Skip leading delimiters
			if (getSourceBufferRemain() > 0) {
				auto currentChar = getDataChar(getSourceAddress() + getSourceBufferOffset());
				while (getSourceBufferRemain() > 0 && ((currentChar == delim)
					|| (delim == ' ' && isspace(static_cast<unsigned char>(currentChar)))
					)) {
					incSourceBufferOffset();
					currentChar = getDataChar(getSourceAddress() + getSourceBufferOffset());
				}
			}
			if (getSourceBufferRemain() > 0) {
				// Copy characters until we see the delimiter again.
				while (getSourceBufferRemain() >0 ) {
					auto currentChar = getDataChar(getSourceAddress() + getSourceBufferOffset());	
					if( currentChar != delim
					&& !(delim == ' ' && (isspace(static_cast<unsigned char>(currentChar))))
					) {
					wordBuffer.push_back(static_cast<unsigned char>(currentChar));
					incSourceBufferOffset();
					} else {
						break;
					}
				}
				// source point to the delimiter char, skip it.
				if (getSourceBufferRemain() >0 ) {
					incSourceBufferOffset(); 
				}
			}
			if (wordBuffer.size() > 255){
				// @bug it is catched below
				throwMessage(std::string("WORD: very long word "), errorParsedStringOverflow); return;
			}
			// Update the count at the beginning of the buffer.
				wordBuffer[0] = static_cast<char>(wordBuffer.size() - 1);
				// copy to fixed buffer
				moveIntoDataSpace(VarOffsetWordBuffer, wordBuffer.c_str(), wordBuffer.size());
				dStack.setTop(CELL(VarOffsetWordBuffer));

		}